

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  dnf_control *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  bool local_952;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  ushort local_88a;
  string local_888;
  allocator<char> local_861;
  string local_860;
  ushort local_83a;
  string local_838;
  allocator<char> local_811;
  string local_810;
  ushort local_7ea;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  ushort local_79a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_780;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_778;
  const_iterator local_770;
  string local_768;
  allocator<char> local_741;
  string local_740;
  ushort local_71a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_700;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6f8;
  const_iterator local_6f0;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  ushort local_69a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_680;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_678;
  const_iterator local_670;
  string local_668;
  allocator<char> local_641;
  string local_640;
  ushort local_61a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_600;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f8;
  const_iterator local_5f0;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  ushort local_59a;
  string local_598;
  allocator<char> local_571;
  string local_570;
  ushort local_54a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_528;
  const_iterator local_520;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  undefined1 local_490 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opt_cmd_ls;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  undefined4 local_36c;
  string local_368;
  string local_348;
  byte local_323;
  byte local_322;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  parser p;
  PmWrapper_pkgoptions optkunniki;
  PmWrapperInterface *pmwrapper;
  char **ppcStack_18;
  msg msgkun;
  char **argv_local;
  int argc_local;
  
  pmwrapper._7_1_ = 0;
  ppcStack_18 = argv;
  this = (dnf_control *)operator_new(8);
  dnf_control::dnf_control(this);
  p.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 0;
  cmdline::parser::parser((parser *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"aptdnf",&local_109);
  cmdline::parser::set_program_name((parser *)local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"version",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"show version",&local_169)
  ;
  cmdline::parser::add((parser *)local_e8,&local_140,'v',&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"yes",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"no confirm",&local_1b9);
  cmdline::parser::add((parser *)local_e8,&local_190,'y',&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"assume-yes",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"no confirm",&local_209);
  cmdline::parser::add((parser *)local_e8,&local_1e0,'\0',&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"download-only",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"Only download the package.",&local_259);
  cmdline::parser::add((parser *)local_e8,&local_230,'d',&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"purge",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"Delete the entire configuration file.",&local_2a9);
  cmdline::parser::add((parser *)local_e8,&local_280,'\0',&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"help",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"show help",&local_2f9);
  cmdline::parser::add((parser *)local_e8,&local_2d0,'h',&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  local_322 = 0;
  local_323 = 0;
  bVar1 = cmdline::parser::parse((parser *)local_e8,argc,ppcStack_18);
  local_952 = true;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_322 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"help",&local_321);
    local_323 = 1;
    local_952 = cmdline::parser::exist((parser *)local_e8,&local_320);
  }
  if ((local_323 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((local_322 & 1) != 0) {
    std::allocator<char>::~allocator(&local_321);
  }
  if (local_952 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"version",&local_391);
    bVar1 = cmdline::parser::exist((parser *)local_e8,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"aptdnf",&local_3b9);
      (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[0xd])(&local_400);
      std::operator+(&local_3e0,"Version : ",&local_400);
      FascodeUtil::msg::print((msg *)((long)&pmwrapper + 7),INFO,&local_3b8,&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      argv_local._4_4_ = 0;
      local_36c = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"yes",&local_421);
      bVar1 = cmdline::parser::exist((parser *)local_e8,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator(&local_421);
      if (bVar1) {
        p.errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_448,"assume-yes",&local_449);
      bVar1 = cmdline::parser::exist((parser *)local_e8,&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::allocator<char>::~allocator(&local_449);
      if (bVar1) {
        p.errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"download-only",
                 (allocator<char> *)
                 ((long)&opt_cmd_ls.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar1 = cmdline::parser::exist((parser *)local_e8,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&opt_cmd_ls.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (bVar1) {
        p.errors.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      }
      __x = cmdline::parser::rest_abi_cxx11_((parser *)local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_490,__x);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_490);
      if (sVar2 == 0) {
        cmdline::parser::error_full_abi_cxx11_(&local_4b0,(parser *)local_e8);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_4b0);
        cmdline::parser::usage_abi_cxx11_(&local_4d0,(parser *)local_e8);
        std::operator<<(poVar3,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4b0);
        argv_local._4_4_ = 0;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_490,0);
        bVar1 = std::operator==(pvVar4,"install");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f0,"aptdnf",&local_4f1);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_490,0);
          std::__cxx11::string::string((string *)&local_518,(string *)pvVar4);
          FascodeUtil::msg::print((msg *)((long)&pmwrapper + 7),DEBUG,&local_4f0,&local_518);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::allocator<char>::~allocator(&local_4f1);
          local_528._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_490);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_520,&local_528);
          local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_490,local_520);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_548,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_490);
          local_54a = p.errors.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
          argv_local._4_4_ =
               (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[2])
                         (this,&local_548,
                          (ulong)p.errors.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_548);
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_490,0);
          bVar1 = std::operator==(pvVar4,"update");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_570,"aptdnf",&local_571);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_490,0);
            std::__cxx11::string::string((string *)&local_598,(string *)pvVar4);
            FascodeUtil::msg::print((msg *)((long)&pmwrapper + 7),DEBUG,&local_570,&local_598);
            std::__cxx11::string::~string((string *)&local_598);
            std::__cxx11::string::~string((string *)&local_570);
            std::allocator<char>::~allocator(&local_571);
            local_59a = p.errors.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
            argv_local._4_4_ =
                 (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[5])
                           (this,(ulong)p.errors.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_490,0);
            bVar1 = std::operator==(pvVar4,"upgrade");
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_5c0,"aptdnf",&local_5c1);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_490,0);
              std::__cxx11::string::string((string *)&local_5e8,(string *)pvVar4);
              FascodeUtil::msg::print((msg *)((long)&pmwrapper + 7),DEBUG,&local_5c0,&local_5e8);
              std::__cxx11::string::~string((string *)&local_5e8);
              std::__cxx11::string::~string((string *)&local_5c0);
              std::allocator<char>::~allocator(&local_5c1);
              local_5f8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_490);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_5f0,&local_5f8);
              local_600 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_490,local_5f0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_618,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_490);
              local_61a = p.errors.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
              argv_local._4_4_ =
                   (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[2])
                             (this,&local_618,
                              (ulong)p.errors.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_618);
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_490,0);
              bVar1 = std::operator==(pvVar4,"remove");
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_640,"aptdnf",&local_641);
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_490,0);
                std::__cxx11::string::string((string *)&local_668,(string *)pvVar4);
                FascodeUtil::msg::print((msg *)((long)&pmwrapper + 7),DEBUG,&local_640,&local_668);
                std::__cxx11::string::~string((string *)&local_668);
                std::__cxx11::string::~string((string *)&local_640);
                std::allocator<char>::~allocator(&local_641);
                local_678._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_490);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ::__normal_iterator<std::__cxx11::string*>
                          ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            *)&local_670,&local_678);
                local_680 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_490,local_670);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_698,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_490);
                local_69a = p.errors.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
                argv_local._4_4_ =
                     (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[3])
                               (this,&local_698,
                                (ulong)p.errors.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_698);
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_490,0);
                bVar1 = std::operator==(pvVar4,"purge");
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_6c0,"aptdnf",&local_6c1);
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_490,0);
                  std::__cxx11::string::string((string *)&local_6e8,(string *)pvVar4);
                  FascodeUtil::msg::print((msg *)((long)&pmwrapper + 7),DEBUG,&local_6c0,&local_6e8)
                  ;
                  std::__cxx11::string::~string((string *)&local_6e8);
                  std::__cxx11::string::~string((string *)&local_6c0);
                  std::allocator<char>::~allocator(&local_6c1);
                  local_6f8._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_490);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ::__normal_iterator<std::__cxx11::string*>
                            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              *)&local_6f0,&local_6f8);
                  local_700 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_490,local_6f0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_718,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_490);
                  local_71a = p.errors.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
                  argv_local._4_4_ =
                       (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[4])
                                 (this,&local_718,
                                  (ulong)p.errors.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_718);
                }
                else {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_490,0);
                  bVar1 = std::operator==(pvVar4,"search");
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_740,"aptdnf",&local_741);
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_490,0);
                    std::__cxx11::string::string((string *)&local_768,(string *)pvVar4);
                    FascodeUtil::msg::print
                              ((msg *)((long)&pmwrapper + 7),DEBUG,&local_740,&local_768);
                    std::__cxx11::string::~string((string *)&local_768);
                    std::__cxx11::string::~string((string *)&local_740);
                    std::allocator<char>::~allocator(&local_741);
                    local_778._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_490);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ::__normal_iterator<std::__cxx11::string*>
                              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                *)&local_770,&local_778);
                    local_780 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_490,local_770);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_798,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_490);
                    local_79a = p.errors.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
                    argv_local._4_4_ =
                         (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[7])
                                   (this,&local_798,
                                    (ulong)p.errors.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_)
                    ;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_798);
                  }
                  else {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_490,0);
                    bVar1 = std::operator==(pvVar4,"full-upgrade");
                    if (bVar1) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_7c0,"aptdnf",&local_7c1);
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_490,0);
                      std::__cxx11::string::string((string *)&local_7e8,(string *)pvVar4);
                      FascodeUtil::msg::print
                                ((msg *)((long)&pmwrapper + 7),DEBUG,&local_7c0,&local_7e8);
                      std::__cxx11::string::~string((string *)&local_7e8);
                      std::__cxx11::string::~string((string *)&local_7c0);
                      std::allocator<char>::~allocator(&local_7c1);
                      local_7ea = p.errors.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
                      argv_local._4_4_ =
                           (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[8])
                                     (this,(ulong)p.errors.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._6_2_);
                    }
                    else {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_490,0);
                      bVar1 = std::operator==(pvVar4,"dist-upgrade");
                      if (bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_810,"aptdnf",&local_811);
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_490,0);
                        std::__cxx11::string::string((string *)&local_838,(string *)pvVar4);
                        FascodeUtil::msg::print
                                  ((msg *)((long)&pmwrapper + 7),DEBUG,&local_810,&local_838);
                        std::__cxx11::string::~string((string *)&local_838);
                        std::__cxx11::string::~string((string *)&local_810);
                        std::allocator<char>::~allocator(&local_811);
                        local_83a = p.errors.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
                        argv_local._4_4_ =
                             (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[10])
                                       (this,(ulong)p.errors.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._6_2_);
                      }
                      else {
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_490,0);
                        bVar1 = std::operator==(pvVar4,"edit-sources");
                        if (bVar1) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_860,"aptdnf",&local_861);
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_490,0);
                          std::__cxx11::string::string((string *)&local_888,(string *)pvVar4);
                          FascodeUtil::msg::print
                                    ((msg *)((long)&pmwrapper + 7),DEBUG,&local_860,&local_888);
                          std::__cxx11::string::~string((string *)&local_888);
                          std::__cxx11::string::~string((string *)&local_860);
                          std::allocator<char>::~allocator(&local_861);
                          local_88a = p.errors.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
                          argv_local._4_4_ =
                               (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[9])
                                         (this,(ulong)p.errors.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._6_2_);
                        }
                        else {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_490,0);
                          bVar1 = std::operator==(pvVar4,"autoremove");
                          if (bVar1) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_8b0,"aptdnf",&local_8b1);
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_490,0);
                            std::__cxx11::string::string((string *)&local_8d8,(string *)pvVar4);
                            FascodeUtil::msg::print
                                      ((msg *)((long)&pmwrapper + 7),DEBUG,&local_8b0,&local_8d8);
                            std::__cxx11::string::~string((string *)&local_8d8);
                            std::__cxx11::string::~string((string *)&local_8b0);
                            std::allocator<char>::~allocator(&local_8b1);
                            argv_local._4_4_ =
                                 (*(this->super_PmWrapperInterface)._vptr_PmWrapperInterface[0xb])
                                           (this,(ulong)p.errors.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._6_2_);
                          }
                          else {
                            argv_local._4_4_ = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_36c = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_490);
    }
  }
  else {
    cmdline::parser::error_full_abi_cxx11_(&local_348,(parser *)local_e8);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_348);
    cmdline::parser::usage_abi_cxx11_(&local_368,(parser *)local_e8);
    std::operator<<(poVar3,(string *)&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_348);
    argv_local._4_4_ = 0;
    local_36c = 1;
  }
  cmdline::parser::~parser((parser *)local_e8);
  return argv_local._4_4_;
}

Assistant:

int main(int argc,char* argv[]){
    FascodeUtil::msg msgkun=FascodeUtil::msg();
    PmWrapperInterface * pmwrapper=new dnf_control;
    PmWrapper_pkgoptions optkunniki;
    optkunniki.downloadonly=false;
    optkunniki.noconfirm=false;
    cmdline::parser p;
    p.set_program_name("aptdnf");
    p.add("version",'v',"show version");
    p.add("yes",'y',"no confirm");
    p.add("assume-yes",0,"no confirm");
    p.add("download-only",'d',"Only download the package.");
    p.add("purge",0,"Delete the entire configuration file.");
    p.add("help",'h',"show help");
    if (!p.parse(argc, argv)||p.exist("help")){
        std::cout<<p.error_full()<<p.usage();
        return 0;
    }
    if(p.exist("version")){
        msgkun.print(FascodeUtil::INFO,"aptdnf","Version : " + pmwrapper->get_core_info());
        return 0;
    }
    if(p.exist("yes")){
        optkunniki.noconfirm=true;
    }
    if(p.exist("assume-yes")){
        optkunniki.noconfirm=true;
    }
    if(p.exist("download-only")){
        optkunniki.downloadonly=true;
    }
    std::vector<std::string> opt_cmd_ls=p.rest();
    if(opt_cmd_ls.size() == 0){
        std::cout<<p.error_full()<<p.usage();
        return 0;
    }
    if(opt_cmd_ls.at(0) == "install") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Install(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "update") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Update(optkunniki);
    }
    if(opt_cmd_ls.at(0) == "upgrade") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Install(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "remove") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Remove(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "purge") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Purge(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "search") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Search(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "full-upgrade") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Full_Upgrade(optkunniki);
    }
    if(opt_cmd_ls.at(0) == "dist-upgrade") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Dist_Upgrade(optkunniki);
    }

    if(opt_cmd_ls.at(0) == "edit-sources") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Edit_sources(optkunniki);
    }
    if(opt_cmd_ls.at(0) == "autoremove") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Autoremove(optkunniki);
    }



    return 0;
}